

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_0::AsyncStreamFd::splicePumpLoop
          (AsyncStreamFd *this,AsyncStreamFd *input,int pipeIn,int pipeOut,uint64_t readSoFar,
          uint64_t limit,size_t bufferedAmount)

{
  PromiseArena *pPVar1;
  byte bVar2;
  undefined8 uVar3;
  OwnPromiseNode OVar4;
  int iVar5;
  void *pvVar6;
  OwnPromiseNode extraout_RAX;
  PromiseNode *extraout_RAX_00;
  PromiseNode *extraout_RAX_01;
  byte *pbVar7;
  undefined4 in_register_00000014;
  _func_int **pp_Var8;
  size_t __len;
  int __fdout;
  undefined1 auVar9 [8];
  TransformPromiseNodeBase *in_stack_00000010;
  Fault f;
  ssize_t n;
  DebugComparison<long_&,_unsigned_long_&> _kjCondition;
  AsyncInputStream local_b8;
  undefined1 local_b0 [16];
  byte *local_a0;
  undefined1 local_98 [8];
  Disposer local_90;
  TransformPromiseNodeBase *local_88;
  AsyncStreamFd *local_80;
  DebugComparison<unsigned_long_&,_unsigned_long_&> local_78;
  OwnPromiseNode local_48;
  Disposer local_40;
  TransformPromiseNodeBase *local_38;
  
  pp_Var8 = (_func_int **)CONCAT44(in_register_00000014,pipeIn);
  local_a0 = (byte *)bufferedAmount;
  local_80 = this;
  local_40._vptr_Disposer = (_func_int **)limit;
  do {
    pbVar7 = local_a0;
    __fdout = (int)readSoFar;
    bVar2 = local_78.result;
    local_b0._8_8_ = local_40._vptr_Disposer;
    for (local_90._vptr_Disposer = (_func_int **)in_stack_00000010; local_78.result = (bool)bVar2,
        (TransformPromiseNodeBase *)local_90._vptr_Disposer != (TransformPromiseNodeBase *)0x0;
        local_90._vptr_Disposer = local_90._vptr_Disposer - local_b0._0_8_) {
      do {
        local_b0._0_8_ =
             splice(pipeOut,(__off64_t *)0x0,(input->super_OwnedFileDescriptor).fd,(__off64_t *)0x0,
                    0x100000,3);
        if (-1 < (long)local_b0._0_8_) goto LAB_00435f4d;
        iVar5 = kj::_::Debug::getOsErrorNumber(true);
      } while (iVar5 == -1);
      if (iVar5 != 0) {
        local_b8._vptr_AsyncInputStream = (_func_int **)0x0;
        local_78.left = (unsigned_long *)0x0;
        local_78.right = (unsigned_long *)0x0;
        kj::_::Debug::Fault::init
                  ((Fault *)&local_b8,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                  );
        kj::_::Debug::Fault::fatal((Fault *)&local_b8);
      }
LAB_00435f4d:
      if ((long)local_b0._0_8_ < 1) {
        local_78.left = (unsigned_long *)local_b0;
        local_78.right = (unsigned_long *)((ulong)local_78.right & 0xffffffff00000000);
        local_78.op.content.ptr = " < ";
        local_78.op.content.size_ = (size_t)&DAT_00000004;
        local_78.result = (bool)(SUB81(local_b0._0_8_,7) >> 7);
        if (-1 < (long)local_b0._0_8_) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&,char_const(&)[49],unsigned_long&>
                    ((Fault *)&local_b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                     ,0x1b5,FAILED,"n < 0",
                     "_kjCondition,\"splice pipe empty before bufferedAmount reached?\", bufferedAmount"
                     ,(DebugComparison<long_&,_int> *)&local_78,
                     (char (*) [49])"splice pipe empty before bufferedAmount reached?",
                     (unsigned_long *)&local_90);
          kj::_::Debug::Fault::fatal((Fault *)&local_b8);
        }
        UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_98);
        auVar9 = local_98;
        local_88 = (TransformPromiseNodeBase *)local_90._vptr_Disposer;
        pPVar1 = ((PromiseArenaMember *)local_98)->arena;
        if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_98 - (long)pPVar1) < 0x50) {
          pvVar6 = operator_new(0x400);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    ((TransformPromiseNodeBase *)((long)pvVar6 + 0x3b0),(OwnPromiseNode *)local_98,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:439:21)>
                     ::anon_class_48_7_4778365b_for_func::operator());
          *(undefined ***)((long)pvVar6 + 0x3b0) = &PTR_destroy_006252d0;
          *(AsyncStreamFd **)((long)pvVar6 + 0x3d0) = input;
          *(_func_int ***)((long)pvVar6 + 0x3d8) = pp_Var8;
          *(int *)((long)pvVar6 + 0x3e0) = pipeOut;
          *(int *)((long)pvVar6 + 0x3e4) = __fdout;
          *(undefined8 *)((long)pvVar6 + 1000) = local_b0._8_8_;
          *(byte **)((long)pvVar6 + 0x3f0) = local_a0;
          *(TransformPromiseNodeBase **)((long)pvVar6 + 0x3f8) = local_88;
          *(void **)((long)pvVar6 + 0x3b8) = pvVar6;
          local_48.ptr = (PromiseNode *)((long)pvVar6 + 0x3b0);
        }
        else {
          ((PromiseArenaMember *)local_98)->arena = (PromiseArena *)0x0;
          local_38 = (TransformPromiseNodeBase *)((long)local_98 + -0x50);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (local_38,(OwnPromiseNode *)local_98,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:439:21)>
                     ::anon_class_48_7_4778365b_for_func::operator());
          ((OwnPromiseNode *)((long)auVar9 + -0x50))->ptr = (PromiseNode *)&PTR_destroy_006252d0;
          ((OwnPromiseNode *)((long)auVar9 + -0x30))->ptr = (PromiseNode *)input;
          ((OwnPromiseNode *)((long)auVar9 + -0x30))[1] = (OwnPromiseNode)pp_Var8;
          *(int *)&(((TransformPromiseNodeBase *)((long)auVar9 + -0x20))->super_PromiseNode).
                   super_PromiseArenaMember._vptr_PromiseArenaMember = pipeOut;
          *(int *)((long)&(((TransformPromiseNodeBase *)((long)auVar9 + -0x20))->super_PromiseNode).
                          super_PromiseArenaMember._vptr_PromiseArenaMember + 4) = __fdout;
          (((TransformPromiseNodeBase *)((long)auVar9 + -0x20))->super_PromiseNode).
          super_PromiseArenaMember.arena = (PromiseArena *)local_b0._8_8_;
          (((Maybe<kj::Own<kj::UnixEventPort::ChildSet,_std::nullptr_t>_> *)((long)auVar9 + -0x10))
          ->ptr).disposer = (Disposer *)local_a0;
          (((Maybe<kj::Own<kj::UnixEventPort::ChildSet,_std::nullptr_t>_> *)((long)auVar9 + -0x10))
          ->ptr).ptr = (ChildSet *)local_88;
          ((OwnPromiseNode *)((long)auVar9 + -0x50))[1] = (OwnPromiseNode)pPVar1;
          local_48.ptr = &local_38->super_PromiseNode;
        }
        local_78.left = &DAT_0048a171;
        local_78.right = (unsigned_long *)&DAT_0048a1d0;
        local_78.op.content.ptr = &DAT_4c0000058b;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                  ((PromiseDisposer *)&local_b8,&local_48,(SourceLocation *)&local_78);
        OVar4.ptr = local_48.ptr;
        (local_80->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream = local_b8._vptr_AsyncInputStream;
        if ((TransformPromiseNodeBase *)local_48.ptr != (TransformPromiseNodeBase *)0x0) {
          local_48.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(&(OVar4.ptr)->super_PromiseArenaMember);
          local_b8._vptr_AsyncInputStream = (_func_int **)extraout_RAX_00;
        }
        auVar9 = local_98;
        if (local_98 == (undefined1  [8])0x0) {
          return (Promise<unsigned_long>)local_b8._vptr_AsyncInputStream;
        }
        local_98 = (undefined1  [8])0x0;
        goto LAB_00436372;
      }
      local_78.left = (unsigned_long *)local_b0;
      local_78.right = (unsigned_long *)&local_90;
      local_78.op.content.ptr = " <= ";
      local_78.op.content.size_ = (size_t)&DAT_00000005;
      local_78.result = local_90._vptr_Disposer >= (ulong)local_b0._0_8_;
      if (local_90._vptr_Disposer < (ulong)local_b0._0_8_) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<long&,unsigned_long&>&,char_const(&)[40]>
                  ((Fault *)&local_b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x1b2,FAILED,"n <= bufferedAmount",
                   "_kjCondition,\"splice pipe larger than bufferedAmount?\"",
                   (DebugComparison<long_&,_unsigned_long_&> *)&local_78,
                   (char (*) [40])"splice pipe larger than bufferedAmount?");
        kj::_::Debug::Fault::fatal((Fault *)&local_b8);
      }
      bVar2 = local_78.result;
    }
    __len = (long)pbVar7 - local_b0._8_8_;
    local_78.result = __len == 0;
    if (pbVar7 < (ulong)local_b0._8_8_ || local_78.result) {
      local_78.left = (unsigned_long *)&local_40;
      local_78.right = &bufferedAmount;
      local_78.op.content.ptr = " == ";
      local_78.op.content.size_ = (size_t)&DAT_00000005;
      if (!local_78.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
                  ((Fault *)&local_b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x1c1,FAILED,"readSoFar == limit","_kjCondition,",&local_78);
        kj::_::Debug::Fault::fatal((Fault *)&local_b8);
      }
      local_90._vptr_Disposer = (_func_int **)0x0;
      pbVar7 = local_a0;
LAB_004363dc:
      local_78.left = (unsigned_long *)pbVar7;
      kj::_::PromiseDisposer::
      alloc<kj::_::ImmediatePromiseNode<unsigned_long>,kj::_::PromiseDisposer,unsigned_long>
                ((PromiseDisposer *)&local_b8,(unsigned_long *)&local_78);
      (local_80->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = local_b8._vptr_AsyncInputStream;
      return (Promise<unsigned_long>)(PromiseNode *)local_b8._vptr_AsyncInputStream;
    }
    local_78.result = (bool)bVar2;
    if (0xfffff < __len) {
      __len = 0x100000;
    }
    while( true ) {
      in_stack_00000010 =
           (TransformPromiseNodeBase *)
           splice(*(int *)(pp_Var8 + 2),(__off64_t *)0x0,__fdout,(__off64_t *)0x0,__len,3);
      if (-1 < (long)in_stack_00000010) break;
      iVar5 = kj::_::Debug::getOsErrorNumber(true);
      if (iVar5 != -1) {
        if (iVar5 != 0) {
          local_b8._vptr_AsyncInputStream = (_func_int **)0x0;
          local_78.left = (unsigned_long *)0x0;
          local_78.right = (unsigned_long *)0x0;
          kj::_::Debug::Fault::init
                    ((Fault *)&local_b8,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                    );
          kj::_::Debug::Fault::fatal((Fault *)&local_b8);
        }
        UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_b0);
        uVar3 = local_b0._0_8_;
        pPVar1 = ((PromiseArenaMember *)local_b0._0_8_)->arena;
        if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_b0._0_8_ - (long)pPVar1) < 0x48) {
          pvVar6 = operator_new(0x400);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    ((TransformPromiseNodeBase *)((long)pvVar6 + 0x3b8),(OwnPromiseNode *)local_b0,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:462:21)>
                     ::anon_class_40_6_95052f75_for_func::operator());
          *(undefined ***)((long)pvVar6 + 0x3b8) = &PTR_destroy_00625328;
          *(AsyncStreamFd **)((long)pvVar6 + 0x3d8) = input;
          *(_func_int ***)((long)pvVar6 + 0x3e0) = pp_Var8;
          *(int *)((long)pvVar6 + 1000) = pipeOut;
          *(int *)((long)pvVar6 + 0x3ec) = __fdout;
          *(undefined8 *)((long)pvVar6 + 0x3f0) = local_b0._8_8_;
          *(byte **)((long)pvVar6 + 0x3f8) = local_a0;
          *(void **)((long)pvVar6 + 0x3c0) = pvVar6;
          local_48.ptr = (PromiseNode *)((long)pvVar6 + 0x3b8);
        }
        else {
          ((PromiseArenaMember *)local_b0._0_8_)->arena = (PromiseArena *)0x0;
          local_88 = (TransformPromiseNodeBase *)((OwnPromiseNode *)(local_b0._0_8_ + -0x50) + 1);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (local_88,(OwnPromiseNode *)local_b0,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:462:21)>
                     ::anon_class_40_6_95052f75_for_func::operator());
          ((OwnPromiseNode *)(uVar3 + -0x50))[1] = (OwnPromiseNode)&PTR_destroy_00625328;
          ((OwnPromiseNode *)(uVar3 + -0x30))[1] = (OwnPromiseNode)input;
          (((TransformPromiseNodeBase *)(uVar3 + -0x20))->super_PromiseNode).
          super_PromiseArenaMember._vptr_PromiseArenaMember = pp_Var8;
          *(int *)&(((TransformPromiseNodeBase *)(uVar3 + -0x20))->super_PromiseNode).
                   super_PromiseArenaMember.arena = pipeOut;
          *(int *)((long)&(((TransformPromiseNodeBase *)(uVar3 + -0x20))->super_PromiseNode).
                          super_PromiseArenaMember.arena + 4) = __fdout;
          (((Maybe<kj::Own<kj::UnixEventPort::ChildSet,_std::nullptr_t>_> *)(uVar3 + -0x10))->ptr).
          disposer = (Disposer *)local_b0._8_8_;
          (((Maybe<kj::Own<kj::UnixEventPort::ChildSet,_std::nullptr_t>_> *)(uVar3 + -0x10))->ptr).
          ptr = (ChildSet *)local_a0;
          (((TransformPromiseNodeBase *)(uVar3 + -0x40))->super_PromiseNode).
          super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
          local_48.ptr = &local_88->super_PromiseNode;
        }
        local_78.left = &DAT_0048a171;
        local_78.right = (unsigned_long *)&DAT_0048a1d0;
        local_78.op.content.ptr = &DAT_4c0000058b;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                  ((PromiseDisposer *)&local_b8,&local_48,(SourceLocation *)&local_78);
        OVar4.ptr = local_48.ptr;
        (local_80->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream = local_b8._vptr_AsyncInputStream;
        if ((TransformPromiseNodeBase *)local_48.ptr != (TransformPromiseNodeBase *)0x0) {
          local_48.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(&(OVar4.ptr)->super_PromiseArenaMember);
          local_b8._vptr_AsyncInputStream = (_func_int **)extraout_RAX.ptr;
        }
        auVar9 = (undefined1  [8])local_b0._0_8_;
        if ((UnixEventPort *)local_b0._0_8_ == (UnixEventPort *)0x0) {
          return (Promise<unsigned_long>)local_b8._vptr_AsyncInputStream;
        }
        local_b0._0_8_ = (UnixEventPort *)0x0;
LAB_00436372:
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar9);
        return (Promise<unsigned_long>)extraout_RAX_01;
      }
    }
    pbVar7 = (byte *)local_b0._8_8_;
    if (in_stack_00000010 == (TransformPromiseNodeBase *)0x0) goto LAB_004363dc;
    local_40._vptr_Disposer =
         (_func_int **)
         ((long)&(in_stack_00000010->super_PromiseNode).super_PromiseArenaMember.
                 _vptr_PromiseArenaMember + local_b0._8_8_);
  } while( true );
}

Assistant:

Promise<uint64_t> splicePumpLoop(AsyncStreamFd& input, int pipeIn, int pipeOut,
                                   uint64_t readSoFar, uint64_t limit, size_t bufferedAmount) {
    for (;;) {
      while (bufferedAmount > 0) {
        // First flush out whatever is in the pipe buffer.
        ssize_t n;
        KJ_NONBLOCKING_SYSCALL(n = splice(pipeIn, nullptr, fd, nullptr,
            MAX_SPLICE_LEN, SPLICE_F_MOVE | SPLICE_F_NONBLOCK));
        if (n > 0) {
          KJ_ASSERT(n <= bufferedAmount, "splice pipe larger than bufferedAmount?");
          bufferedAmount -= n;
        } else {
          KJ_ASSERT(n < 0, "splice pipe empty before bufferedAmount reached?", bufferedAmount);
          return observer.whenBecomesWritable()
              .then([this, &input, pipeIn, pipeOut, readSoFar, limit, bufferedAmount]() {
            return splicePumpLoop(input, pipeIn, pipeOut, readSoFar, limit, bufferedAmount);
          });
        }
      }

      // Now the pipe buffer is empty, so we can try to read some more.
      {
        if (readSoFar >= limit) {
          // Hit the limit, we're done.
          KJ_ASSERT(readSoFar == limit);
          return readSoFar;
        }

        ssize_t n;
        KJ_NONBLOCKING_SYSCALL(n = splice(input.fd, nullptr, pipeOut, nullptr,
            kj::min(limit - readSoFar, MAX_SPLICE_LEN), SPLICE_F_MOVE | SPLICE_F_NONBLOCK));
        if (n == 0) {
          // EOF.
          return readSoFar;
        } else if (n < 0) {
          // No data available, wait.
          return input.observer.whenBecomesReadable()
              .then([this, &input, pipeIn, pipeOut, readSoFar, limit]() {
            return splicePumpLoop(input, pipeIn, pipeOut, readSoFar, limit, 0);
          });
        }

        readSoFar += n;
        bufferedAmount = n;
      }
    }
  }